

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typer.hpp
# Opt level: O3

void __thiscall
Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::~TypeRecipient
          (TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper> *this)

{
  Typer *pTVar1;
  
  (this->super_Delegate).super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059ef60;
  pTVar1 = (this->previous_typer_)._M_t.
           super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
           super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
           super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  if (pTVar1 != (Typer *)0x0) {
    std::default_delete<Utility::Typer>::operator()
              ((default_delete<Utility::Typer> *)&this->previous_typer_,pTVar1);
  }
  (this->previous_typer_)._M_t.
  super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
  super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  pTVar1 = (this->typer_)._M_t.
           super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>._M_t.
           super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
           super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl;
  if (pTVar1 != (Typer *)0x0) {
    std::default_delete<Utility::Typer>::operator()
              ((default_delete<Utility::Typer> *)&this->typer_,pTVar1);
  }
  (this->typer_)._M_t.super___uniq_ptr_impl<Utility::Typer,_std::default_delete<Utility::Typer>_>.
  _M_t.super__Tuple_impl<0UL,_Utility::Typer_*,_std::default_delete<Utility::Typer>_>.
  super__Head_base<0UL,_Utility::Typer_*,_false>._M_head_impl = (Typer *)0x0;
  return;
}

Assistant:

TypeRecipient(Args&&... args) : character_mapper(std::forward<Args>(args)...) {}